

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void xmlRaiseMemoryError(xmlStructuredErrorFunc schannel,xmlGenericErrorFunc channel,void *data,
                        int domain,xmlError *error)

{
  xmlStructuredErrorFunc p_Var1;
  xmlError *pxVar2;
  xmlStructuredErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlError *lastError;
  xmlError *error_local;
  int domain_local;
  void *data_local;
  xmlGenericErrorFunc channel_local;
  xmlStructuredErrorFunc schannel_local;
  
  pxVar2 = xmlGetLastErrorInternal();
  xmlResetLastError();
  pxVar2->domain = domain;
  pxVar2->code = 2;
  pxVar2->level = XML_ERR_FATAL;
  if (error != (xmlError *)0x0) {
    xmlResetError(error);
    error->domain = domain;
    error->code = 2;
    error->level = XML_ERR_FATAL;
  }
  if (schannel == (xmlStructuredErrorFunc)0x0) {
    pp_Var3 = __xmlStructuredError();
    if (*pp_Var3 == (xmlStructuredErrorFunc)0x0) {
      if (channel != (xmlGenericErrorFunc)0x0) {
        (*channel)(data,"libxml2: out of memory\n");
      }
    }
    else {
      pp_Var3 = __xmlStructuredError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlStructuredErrorContext();
      (*p_Var1)(*ppvVar4,pxVar2);
    }
  }
  else {
    (*schannel)(data,pxVar2);
  }
  return;
}

Assistant:

void
xmlRaiseMemoryError(xmlStructuredErrorFunc schannel, xmlGenericErrorFunc channel,
                    void *data, int domain, xmlError *error)
{
    xmlError *lastError = xmlGetLastErrorInternal();

    xmlResetLastError();
    lastError->domain = domain;
    lastError->code = XML_ERR_NO_MEMORY;
    lastError->level = XML_ERR_FATAL;

    if (error != NULL) {
        xmlResetError(error);
        error->domain = domain;
        error->code = XML_ERR_NO_MEMORY;
        error->level = XML_ERR_FATAL;
    }

    if (schannel != NULL) {
        schannel(data, lastError);
    } else if (xmlStructuredError != NULL) {
        xmlStructuredError(xmlStructuredErrorContext, lastError);
    } else if (channel != NULL) {
        channel(data, "libxml2: out of memory\n");
    }
}